

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void PPrintComment(TidyDocImpl *doc,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  uint uVar1;
  
  pprint = &doc->pprint;
  uVar1 = (doc->pprint).linelen;
  if ((ulong)(uVar1 + indent) < (doc->config).value[0x5d].v) {
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = indent;
    }
    (doc->pprint).wraphere = uVar1;
  }
  else if ((doc->pprint).ixInd == 0) {
    (doc->pprint).indent[1].spaces = indent;
    (doc->pprint).ixInd = 1;
  }
  AddString(pprint,"<!--");
  PPrintText(doc,2,0,node);
  AddString(pprint,"--");
  AddChar(pprint,0x3e);
  if ((node->linebreak != no) && (node->next != (Node *)0x0)) {
    PFlushLineSmart(doc,indent);
    return;
  }
  return;
}

Assistant:

static void PPrintComment( TidyDocImpl* doc, uint indent, Node* node )
{
    TidyPrintImpl* pprint = &doc->pprint;

    SetWrap( doc, indent );
    AddString( pprint, "<!--" );

    PPrintText(doc, COMMENT, 0, node);

    AddString(pprint, "--");
    AddChar( pprint, '>' );
    if ( node->linebreak && node->next )
        PFlushLineSmart( doc, indent );
}